

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasCordFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  long lVar3;
  long lVar4;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      __once = *(once_flag **)(lVar1 + 0x30 + lVar3);
      if (__once != (once_flag *)0x0) {
        local_40 = (FieldDescriptor *)(lVar1 + lVar3);
        local_38 = FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_38,&local_40);
      }
      if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x38 + lVar3) * 4
                    ) == 9) && (options->opensource_runtime == false)) &&
         (*(int *)(*(long *)(lVar1 + 0x78 + lVar3) + 0x48) == 1)) {
        return true;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar4 < *(int *)(descriptor + 0x68));
  }
  if (*(int *)(descriptor + 0x70) < 1) {
    bVar2 = false;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    do {
      bVar2 = HasCordFields((Descriptor *)(*(long *)(descriptor + 0x38) + lVar4),options);
      if (bVar2) {
        return bVar2;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x90;
    } while (lVar3 < *(int *)(descriptor + 0x70));
  }
  return bVar2;
}

Assistant:

static bool HasCordFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsCordField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasCordFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}